

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ray.h
# Opt level: O2

Vector * __thiscall Ray::point(Vector *__return_storage_ptr__,Ray *this,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->dir).z;
  dVar2 = (this->org).z;
  dVar3 = (this->org).y;
  dVar4 = (this->dir).y;
  __return_storage_ptr__->x = t * (this->dir).x + (this->org).x;
  __return_storage_ptr__->y = t * dVar4 + dVar3;
  __return_storage_ptr__->z = dVar1 * t + dVar2;
  return __return_storage_ptr__;
}

Assistant:

Vector point( double t ) { return org + dir * t; }